

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<std::unordered_set<bool,std::hash<bool>,std::equal_to<bool>,std::allocator<bool>>,void>
               (unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>
                *container,ostream *os)

{
  char8_t *pcVar1;
  _Hash_node_base *p_Var2;
  long lVar3;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  p_Var2 = (container->_M_h)._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    lVar3 = 0;
    do {
      if ((lVar3 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1), lVar3 == 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        goto LAB_001d93ff;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      pcVar1 = "some_false";
      if ((ulong)*(byte *)&p_Var2[1]._M_nxt != 0) {
        pcVar1 = "some_true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (os,pcVar1 + 5,(ulong)*(byte *)&p_Var2[1]._M_nxt ^ 5);
      lVar3 = lVar3 + 1;
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
    if (lVar3 != 0) {
LAB_001d93ff:
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }